

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

int run_test_unref_in_prepare_cb(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 in_R9;
  uv_prepare_t h;
  undefined1 auStack_1d8 [152];
  code *pcStack_140;
  undefined1 auStack_130 [152];
  code *pcStack_98;
  code *pcStack_90;
  undefined1 local_80 [120];
  
  pcStack_90 = (code *)0x1692ec;
  uVar2 = uv_default_loop();
  pcStack_90 = (code *)0x1692fc;
  uv_prepare_init(uVar2,local_80);
  pcStack_90 = (code *)0x16930b;
  uv_prepare_start(local_80,prepare_cb);
  pcStack_90 = (code *)0x169310;
  uVar2 = uv_default_loop();
  pcStack_90 = (code *)0x16931a;
  uv_run(uVar2,0);
  pcStack_90 = (code *)0x169322;
  do_close(local_80);
  pcStack_90 = (code *)0x169327;
  uVar2 = uv_default_loop();
  pcStack_90 = (code *)0x16933b;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_90 = (code *)0x169345;
  uv_run(uVar2,0);
  pcStack_90 = (code *)0x16934a;
  lVar3 = uv_default_loop();
  pcStack_90 = (code *)0x169352;
  iVar1 = uv_loop_close();
  if (iVar1 == 0) {
    return 0;
  }
  pcStack_90 = prepare_cb;
  run_test_unref_in_prepare_cb_cold_1();
  if (lVar3 != 0) {
    iVar1 = uv_unref();
    return iVar1;
  }
  pcStack_98 = run_test_timer_ref;
  prepare_cb_cold_1();
  pcStack_140 = (code *)0x169382;
  pcStack_98 = (code *)uVar2;
  uVar2 = uv_default_loop();
  pcStack_140 = (code *)0x169392;
  uv_timer_init(uVar2,auStack_130);
  pcStack_140 = (code *)0x16939a;
  uv_unref(auStack_130);
  pcStack_140 = (code *)0x16939f;
  uVar2 = uv_default_loop();
  pcStack_140 = (code *)0x1693a9;
  uv_run(uVar2,0);
  pcStack_140 = (code *)0x1693b1;
  do_close(auStack_130);
  pcStack_140 = (code *)0x1693b6;
  uVar2 = uv_default_loop();
  pcStack_140 = (code *)0x1693ca;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_140 = (code *)0x1693d4;
  uv_run(uVar2,0);
  pcStack_140 = (code *)0x1693d9;
  uVar4 = uv_default_loop();
  pcStack_140 = (code *)0x1693e1;
  iVar1 = uv_loop_close(uVar4);
  if (iVar1 == 0) {
    return 0;
  }
  pcStack_140 = run_test_timer_ref2;
  run_test_timer_ref_cold_1();
  pcStack_140 = (code *)uVar2;
  uVar2 = uv_default_loop();
  uv_timer_init(uVar2,auStack_1d8);
  uv_timer_start(auStack_1d8,fail_cb,0x2a,0x2a);
  uv_unref(auStack_1d8);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  do_close(auStack_1d8);
  uVar2 = uv_default_loop();
  uv_walk(uVar2,close_walk_cb,0);
  uv_run(uVar2,0);
  uVar4 = uv_default_loop();
  iVar1 = uv_loop_close(uVar4);
  if (iVar1 == 0) {
    return 0;
  }
  run_test_timer_ref2_cold_1();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
          ,0x39,"fail_cb should not have been called",in_R9,uVar2);
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(unref_in_prepare_cb) {
  uv_prepare_t h;
  uv_prepare_init(uv_default_loop(), &h);
  uv_prepare_start(&h, prepare_cb);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY();
  return 0;
}